

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::iterateShaders
               (NegativeTestContext *ctx,TestCase testCase)

{
  ShaderType shaderType;
  RenderContext *renderCtx;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *sources;
  long lVar4;
  GLint maxBuffers;
  TestLog *local_3a8;
  ulong local_3a0;
  string local_398 [32];
  undefined1 local_378 [40];
  ShaderProgram program;
  ProgramSources local_280;
  undefined1 local_1b0 [384];
  
  local_3a8 = (ctx->super_CallLogWrapper).m_log;
  lVar4 = 0;
  local_3a0 = (ulong)testCase;
  do {
    if (lVar4 == 0x18) {
      return;
    }
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar4);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&program,"Verify shader: ",(allocator<char> *)&local_280);
      pcVar2 = glu::getShaderTypeName(shaderType);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&program,
                     pcVar2);
      NegativeTestContext::beginSection(ctx,(string *)local_1b0);
      std::__cxx11::string::~string((string *)local_1b0);
      std::__cxx11::string::~string((string *)&program);
      renderCtx = ctx->m_renderCtx;
      memset(&local_280,0,0xac);
      local_280.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_280.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_280.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      local_280.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_280._193_8_ = 0;
      maxBuffers = -1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      glu::CallLogWrapper::glGetIntegerv(&ctx->super_CallLogWrapper,0x92dc,&maxBuffers);
      pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
      poVar3 = std::operator<<((ostream *)local_1b0,pcVar2);
      std::operator<<(poVar3,"\n");
      pcVar2 = "#extension GL_EXT_tessellation_shader : enable\n";
      if (shaderType - SHADERTYPE_TESSELLATION_CONTROL < 2) {
LAB_01358bb4:
        std::operator<<((ostream *)local_1b0,pcVar2);
      }
      else if (shaderType == SHADERTYPE_GEOMETRY) {
        std::operator<<((ostream *)local_1b0,"#extension GL_EXT_geometry_shader : enable\n");
        pcVar2 = "layout(max_vertices = 3) out;\n";
        goto LAB_01358bb4;
      }
      if (testCase < TESTCASE_BODY_DECLARE) {
        (*(code *)(&DAT_018d0190 + *(int *)(&DAT_018d0190 + local_3a0 * 4)))();
        return;
      }
      poVar3 = std::operator<<((ostream *)local_1b0,"void main (void)\n");
      std::operator<<(poVar3,"{\n");
      pcVar2 = "counter = 1;\n";
      if (testCase == TESTCASE_BODY_WRITE) {
LAB_01358d02:
        std::operator<<((ostream *)local_1b0,pcVar2);
      }
      else if (testCase == TESTCASE_BODY_DECLARE) {
        pcVar2 = "atomic_uint counter;\n";
        goto LAB_01358d02;
      }
      std::operator<<((ostream *)local_1b0,"}\n");
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      local_378._0_4_ = shaderType;
      std::__cxx11::string::string((string *)(local_378 + 8),local_398);
      sources = glu::ProgramSources::operator<<(&local_280,(ShaderSource *)local_378);
      glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
      std::__cxx11::string::~string((string *)(local_378 + 8));
      std::__cxx11::string::~string(local_398);
      glu::ProgramSources::~ProgramSources(&local_280);
      if (*(bool *)((long)&(*program.m_shaders[shaderType].
                             super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                             _M_impl.super__Vector_impl_data._M_start)->m_info + 0x48) == true) {
        glu::operator<<(local_3a8,&program);
        local_1b0._0_8_ = local_3a8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),
                        "Expected program to fail, but compilation passed.");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,"Shader was not expected to compile.",
                   (allocator<char> *)&local_280);
        NegativeTestContext::fail(ctx,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
      }
      NegativeTestContext::endSection(ctx);
      glu::ShaderProgram::~ShaderProgram(&program);
    }
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

void iterateShaders (NegativeTestContext& ctx, TestCase testCase)
{
	tcu::TestLog& log = ctx.getLog();
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_shaders); ndx++)
	{
		if (ctx.isShaderSupported(s_shaders[ndx]))
		{
			ctx.beginSection(std::string("Verify shader: ") + glu::getShaderTypeName(s_shaders[ndx]));
			const glu::ShaderProgram program(ctx.getRenderContext(), glu::ProgramSources() << glu::ShaderSource(s_shaders[ndx], genShaderSource(ctx, testCase, s_shaders[ndx])));
			if (program.getShaderInfo(s_shaders[ndx]).compileOk)
			{
				log << program;
				log << tcu::TestLog::Message << "Expected program to fail, but compilation passed." << tcu::TestLog::EndMessage;
				ctx.fail("Shader was not expected to compile.");
			}
			ctx.endSection();
		}
	}
}